

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O3

string * __thiscall
google::protobuf::compiler::php::(anonymous_namespace)::FilenameToClassname_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,string_view filename)

{
  _anonymous_namespace_ *p_Var1;
  pointer pcVar2;
  _anonymous_namespace_ *p_Var3;
  string *psVar4;
  _anonymous_namespace_ *p_Var5;
  string *psVar6;
  size_t sVar7;
  
  sVar7 = filename._M_len;
  p_Var5 = this;
  if (this == (_anonymous_namespace_ *)0x0) {
LAB_002ea397:
    p_Var3 = (_anonymous_namespace_ *)0xffffffffffffffff;
  }
  else {
    do {
      p_Var3 = p_Var5 + -1;
      if (p_Var5 == (_anonymous_namespace_ *)0x0) goto LAB_002ea397;
      p_Var1 = p_Var5 + (sVar7 - 1);
      p_Var5 = p_Var3;
    } while (*p_Var1 != (_anonymous_namespace_)0x2e);
  }
  if (this < p_Var3) {
    p_Var3 = this;
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,sVar7,p_Var3 + sVar7);
  psVar4 = (string *)__return_storage_ptr__->_M_string_length;
  if (psVar4 != (string *)0x0) {
    psVar6 = (string *)0x0;
    do {
      pcVar2 = (__return_storage_ptr__->_M_dataplus)._M_p;
      if (pcVar2[(long)&(psVar6->_M_dataplus)._M_p] == '/') {
        pcVar2[(long)&(psVar6->_M_dataplus)._M_p] = '\\';
        psVar4 = (string *)__return_storage_ptr__->_M_string_length;
      }
      psVar6 = (string *)((long)&(psVar6->_M_dataplus)._M_p + 1);
    } while (psVar6 < psVar4);
  }
  return psVar4;
}

Assistant:

std::string FilenameToClassname(absl::string_view filename) {
  size_t lastindex = filename.find_last_of('.');
  std::string result(filename.substr(0, lastindex));
  for (size_t i = 0; i < result.size(); i++) {
    if (result[i] == '/') {
      result[i] = '\\';
    }
  }
  return result;
}